

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

int WildMidi_Close(midi *handle)

{
  _hndl *p_Var1;
  _hndl *local_28;
  _hndl *tmp_handle;
  _mdi *mdi;
  midi *handle_local;
  
  if (WM_Initialized == 0) {
    _WM_ERROR("WildMidi_Close",0xa37,8,(char *)0x0,0);
    handle_local._4_4_ = -1;
  }
  else if (handle == (midi *)0x0) {
    _WM_ERROR("WildMidi_Close",0xa3b,9,"(NULL handle)",0);
    handle_local._4_4_ = -1;
  }
  else if (first_handle == (_hndl *)0x0) {
    _WM_ERROR("WildMidi_Close",0xa40,9,"(no midi\'s open)",0);
    handle_local._4_4_ = -1;
  }
  else {
    FCriticalSection::Enter((FCriticalSection *)handle);
    if (first_handle->handle == handle) {
      p_Var1 = first_handle->next;
      free(first_handle);
      first_handle = p_Var1;
      if (p_Var1 != (_hndl *)0x0) {
        p_Var1->prev = (_hndl *)0x0;
      }
    }
    else {
      local_28 = first_handle;
      do {
        if (local_28->handle == handle) break;
        local_28 = local_28->next;
      } while (local_28 != (_hndl *)0x0);
      if (local_28 != (_hndl *)0x0) {
        local_28->prev->next = local_28->next;
        if (local_28->next != (_hndl *)0x0) {
          local_28->next->prev = local_28->prev;
        }
        free(local_28);
      }
    }
    freeMDI((_mdi *)handle);
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

WM_SYMBOL int WildMidi_Close(midi * handle) {
	struct _mdi *mdi = (struct _mdi *) handle;
	struct _hndl * tmp_handle;

	if (!WM_Initialized) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_NOT_INIT, NULL, 0);
		return -1;
	}
	if (handle == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(NULL handle)",
				0);
		return -1;
	}
	if (first_handle == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(no midi's open)",
				0);
		return -1;
	}
	mdi->lock.Enter();
	if (first_handle->handle == handle) {
		tmp_handle = first_handle->next;
		free(first_handle);
		first_handle = tmp_handle;
		if (first_handle)
			first_handle->prev = NULL;
	} else {
		tmp_handle = first_handle;
		while (tmp_handle->handle != handle) {
			tmp_handle = tmp_handle->next;
			if (tmp_handle == NULL) {
				break;
			}
		}
		if (tmp_handle) {
			tmp_handle->prev->next = tmp_handle->next;
			if (tmp_handle->next) {
				tmp_handle->next->prev = tmp_handle->prev;
			}
			free(tmp_handle);
		}
	}

	freeMDI(mdi);

	return 0;
}